

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vprtybq_ppc64(ppc_avr_t *r,ppc_avr_t *b)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (b->u64[1] ^ b->u64[0]) >> 0x20 ^ b->u64[1] ^ b->u64[0];
  uVar1 = (uint)(uVar2 >> 0x10) ^ (uint)uVar2;
  *(ulong *)r = (ulong)((uVar1 >> 8 ^ uVar1) & 1);
  r->u64[1] = 0;
  return;
}

Assistant:

void helper_vprtybq(ppc_avr_t *r, ppc_avr_t *b)
{
    uint64_t res = b->u64[0] ^ b->u64[1];
    res ^= res >> 32;
    res ^= res >> 16;
    res ^= res >> 8;
    r->VsrD(1) = res & 1;
    r->VsrD(0) = 0;
}